

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printVectorIndex(MCInst *MI,uint OpNum,SStream *O)

{
  MCOperand *pMVar1;
  int64_t iVar2;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  SStream_concat0(O,"[");
  pMVar1 = MCInst_getOperand(MI,OpNum);
  iVar2 = MCOperand_getImm(pMVar1);
  printInt32(O,(int32_t)iVar2);
  SStream_concat0(O,"]");
  if (MI->csh->detail != CS_OPT_OFF) {
    pMVar1 = MCInst_getOperand(MI,OpNum);
    iVar2 = MCOperand_getImm(pMVar1);
    *(int *)(MI->flat_insn->detail->groups +
            (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x16) =
         (int)iVar2;
  }
  return;
}

Assistant:

static void printVectorIndex(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned tmp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "[0x%x]",tmp);
	else
		SStream_concat(O, "[%u]",tmp);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].vector_index = tmp;
	}
}